

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeSpan.h
# Opt level: O2

string * __thiscall
libsgp4::TimeSpan::ToString_abi_cxx11_(string *__return_storage_ptr__,TimeSpan *this)

{
  int iVar1;
  ostream *poVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  stringstream ss;
  long local_198 [2];
  undefined8 uStack_188;
  uint auStack_180 [88];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  *(uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18)) =
       *(uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18)) & 0xffffff4f | 0x80;
  std::operator<<((ostream *)local_198,0x30);
  lVar3 = this->m_ticks;
  if (lVar3 < 0) {
    std::operator<<((ostream *)local_198,'-');
    lVar3 = this->m_ticks;
  }
  if (0x283baebffe < lVar3 + 86399999999U) {
    *(undefined8 *)((long)&uStack_188 + *(long *)(local_198[0] + -0x18)) = 2;
    iVar1 = (int)(lVar3 / 86400000000);
    iVar5 = -iVar1;
    if (0 < iVar1) {
      iVar5 = iVar1;
    }
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_198,iVar5);
    std::operator<<(poVar2,'.');
    lVar3 = this->m_ticks;
  }
  *(undefined8 *)((long)&uStack_188 + *(long *)(local_198[0] + -0x18)) = 2;
  iVar1 = (int)((lVar3 % 86400000000) / 3600000000);
  iVar5 = -iVar1;
  if (0 < iVar1) {
    iVar5 = iVar1;
  }
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_198,iVar5);
  std::operator<<(poVar2,':');
  *(undefined8 *)((long)&uStack_188 + *(long *)(local_198[0] + -0x18)) = 2;
  iVar1 = (int)((this->m_ticks % 3600000000) / 60000000);
  iVar5 = -iVar1;
  if (0 < iVar1) {
    iVar5 = iVar1;
  }
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_198,iVar5);
  std::operator<<(poVar2,':');
  *(undefined8 *)((long)&uStack_188 + *(long *)(local_198[0] + -0x18)) = 2;
  uVar4 = this->m_ticks % 60000000;
  iVar1 = (int)((long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar4 & 0xffffffff) / 1000000);
  iVar5 = -iVar1;
  if (0 < iVar1) {
    iVar5 = iVar1;
  }
  std::ostream::operator<<((ostream *)local_198,iVar5);
  if (this->m_ticks % 1000000 != 0) {
    poVar2 = std::operator<<((ostream *)local_198,'.');
    *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 6;
    iVar1 = (int)(this->m_ticks % 1000000);
    iVar5 = -iVar1;
    if (0 < iVar1) {
      iVar5 = iVar1;
    }
    std::ostream::operator<<((ostream *)poVar2,iVar5);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString() const
    {
        std::stringstream ss;

        ss << std::right << std::setfill('0');
        
        if (m_ticks < 0)
        {
            ss << '-';
        }

        if (Days() != 0)
        {
            ss << std::setw(2) << std::abs(Days()) << '.';
        }

        ss << std::setw(2) << std::abs(Hours()) << ':';
        ss << std::setw(2) << std::abs(Minutes()) << ':';
        ss << std::setw(2) << std::abs(Seconds());

        if (Microseconds() != 0)
        {
            ss << '.' << std::setw(6) << std::abs(Microseconds());
        }

        return ss.str();
    }